

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall crnlib::crn_comp::~crn_comp(crn_comp *this)

{
  long lVar1;
  
  (this->super_itexture_comp)._vptr_itexture_comp = (_func_int **)&PTR__crn_comp_001b68b0;
  vector<unsigned_char>::~vector(&this->m_packed_alpha_selectors);
  vector<unsigned_char>::~vector(&this->m_packed_alpha_endpoints);
  vector<unsigned_char>::~vector(&this->m_packed_color_selectors);
  vector<unsigned_char>::~vector(&this->m_packed_color_endpoints);
  vector<unsigned_char>::~vector(&this->m_packed_data_models);
  lVar1 = 0;
  do {
    vector<unsigned_char>::~vector
              ((vector<unsigned_char> *)((long)&this->m_packed_blocks[0xf].m_p + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -0x100);
  lVar1 = 0;
  do {
    static_huffman_data_model::~static_huffman_data_model
              ((static_huffman_data_model *)((long)this->m_packed_blocks + lVar1 + -0x38));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0x70);
  lVar1 = 0;
  do {
    vector<unsigned_int>::~vector
              ((vector<unsigned_int> *)((long)&this->m_selector_index_hist[1].m_hist.m_p + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -0x20);
  lVar1 = 0;
  do {
    vector<unsigned_short>::~vector
              ((vector<unsigned_short> *)((long)&this->m_selector_remaping[1].m_p + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -0x20);
  lVar1 = 0;
  do {
    static_huffman_data_model::~static_huffman_data_model
              ((static_huffman_data_model *)((long)this->m_selector_remaping + lVar1 + -0x38));
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0x70);
  lVar1 = 0;
  do {
    vector<unsigned_int>::~vector
              ((vector<unsigned_int> *)((long)&this->m_endpoint_index_hist[1].m_hist.m_p + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -0x20);
  lVar1 = 0;
  do {
    vector<unsigned_short>::~vector
              ((vector<unsigned_short> *)((long)&this->m_endpoint_remaping[1].m_p + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -0x20);
  static_huffman_data_model::~static_huffman_data_model(&this->m_reference_dm);
  vector<unsigned_int>::~vector(&(this->m_reference_hist).m_hist);
  dxt_hc::~dxt_hc(&this->m_hvq);
  vector<unsigned_char>::~vector(&this->m_comp_data);
  vector<crnlib::dxt_hc::selector_indices_details>::~vector(&this->m_selector_indices);
  vector<crnlib::dxt_hc::endpoint_indices_details>::~vector(&this->m_endpoint_indices);
  vector<unsigned_long_long>::~vector(&this->m_alpha_selectors);
  vector<unsigned_int>::~vector(&this->m_color_selectors);
  vector<unsigned_int>::~vector(&this->m_alpha_endpoints);
  vector<unsigned_int>::~vector(&this->m_color_endpoints);
  vector<crnlib::crn_comp::level_details>::~vector(&this->m_levels);
  lVar1 = 0x1c70;
  do {
    vector<crnlib::color_quad<unsigned_char,_int>_>::~vector
              ((vector<crnlib::color_quad<unsigned_char,_int>_> *)
               ((long)(this->m_task_pool).m_task_stack.m_stack + lVar1 + -0x10));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != 0xa70);
  task_pool::~task_pool(&this->m_task_pool);
  return;
}

Assistant:

crn_comp::~crn_comp() {
}